

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O0

int __thiscall de::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  deSocket *sock;
  deBool dVar1;
  deSocketAddress *address;
  SocketError *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  SocketAddress *local_18;
  SocketAddress *address_local;
  Socket *this_local;
  
  local_18 = (SocketAddress *)CONCAT44(in_register_00000034,__fd);
  sock = this->m_socket;
  address_local = (SocketAddress *)this;
  address = SocketAddress::operator_cast_to_deSocketAddress_s_(local_18);
  dVar1 = deSocket_connect(sock,address);
  if (dVar1 == 0) {
    this_00 = (SocketError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Connecting socket failed",&local_39);
    SocketError::SocketError(this_00,&local_38);
    __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
  }
  return dVar1;
}

Assistant:

void Socket::connect (const SocketAddress& address)
{
	if (!deSocket_connect(m_socket, address))
		throw SocketError("Connecting socket failed");
}